

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QGraphicsScene * qvariant_cast<QGraphicsScene*>(QVariant *v)

{
  bool bVar1;
  QGraphicsScene **ppQVar2;
  QMetaType *pQVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  QGraphicsScene *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffb8;
  Private *in_stack_ffffffffffffffc0;
  QGraphicsScene *local_30;
  QGraphicsScene *local_20;
  QMetaTypeInterface *local_18;
  QMetaTypeInterface *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QMetaTypeInterface *)QMetaType::fromType<QGraphicsScene*>();
  local_18 = (QMetaTypeInterface *)QVariant::Private::type(in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    ppQVar2 = QVariant::Private::get<QGraphicsScene*>((Private *)0x9defaf);
    local_30 = *ppQVar2;
  }
  else {
    local_20 = (QGraphicsScene *)0x0;
    pQVar3 = (QMetaType *)QVariant::metaType();
    pvVar4 = QVariant::constData((QVariant *)0x9defdb);
    QMetaType::convert(pQVar3,pvVar4,(QMetaType *)local_10,&local_20);
    local_30 = local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}